

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_statistics.cpp
# Opt level: O1

unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
__thiscall duckdb::DistinctStatistics::Copy(DistinctStatistics *this)

{
  _Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_> this_00;
  pointer *__ptr;
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> *in_RSI;
  HyperLogLog *local_28;
  _Head_base<0UL,_duckdb::HyperLogLog_*,_false> local_20;
  
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::operator->
            (in_RSI);
  HyperLogLog::Copy((HyperLogLog *)&local_28);
  this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::HyperLogLog_*,_false>)operator_new(0x18);
  local_20._M_head_impl = local_28;
  local_28 = (HyperLogLog *)0x0;
  DistinctStatistics((DistinctStatistics *)
                     this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl,
                     (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                      *)&local_20,
                     (idx_t)in_RSI[1].
                            super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>
                            .super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl,
                     (idx_t)in_RSI[2].
                            super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>
                            .super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl);
  (this->log).super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
  super__Head_base<0UL,_duckdb::HyperLogLog_*,_false> =
       this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl;
  if (local_20._M_head_impl != (HyperLogLog *)0x0) {
    operator_delete(local_20._M_head_impl);
  }
  if (local_28 != (HyperLogLog *)0x0) {
    operator_delete(local_28);
  }
  return (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         this;
}

Assistant:

unique_ptr<DistinctStatistics> DistinctStatistics::Copy() const {
	return make_uniq<DistinctStatistics>(log->Copy(), sample_count, total_count);
}